

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

U64 ZSTD_rollingHash_append(U64 hash,void *buf,size_t size)

{
  size_t sVar1;
  
  for (sVar1 = 0; size != sVar1; sVar1 = sVar1 + 1) {
    hash = hash * -0x30e44323485a9b9d + (ulong)*(byte *)((long)buf + sVar1) + 10;
  }
  return hash;
}

Assistant:

static U64 ZSTD_rollingHash_append(U64 hash, void const* buf, size_t size)
{
    BYTE const* istart = (BYTE const*)buf;
    size_t pos;
    for (pos = 0; pos < size; ++pos) {
        hash *= prime8bytes;
        hash += istart[pos] + ZSTD_ROLL_HASH_CHAR_OFFSET;
    }
    return hash;
}